

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O2

void __thiscall
kj::_::anon_unknown_0::ThrowingDestructor::~ThrowingDestructor(ThrowingDestructor *this)

{
  bool bVar1;
  undefined1 extraout_AL;
  undefined7 extraout_var;
  anon_class_1_0_00000001 *this_00;
  
  this_00 = (anon_class_1_0_00000001 *)this;
  bVar1 = UnwindDetector::isUnwinding(&this->super_UnwindDetector);
  if (bVar1) {
    ~ThrowingDestructor::anon_class_1_0_00000001::operator()(this_00);
  }
  ~ThrowingDestructor::anon_class_1_0_00000001::operator()(this_00);
  __cxa_begin_catch(CONCAT71(extraout_var,extraout_AL));
  UnwindDetector::catchThrownExceptionAsSecondaryFault(&this->super_UnwindDetector);
  __cxa_end_catch();
  return;
}

Assistant:

~ThrowingDestructor() noexcept(false) {
    catchExceptionsIfUnwinding([]() {
      KJ_FAIL_ASSERT("this is a test, not a real bug");
    });
  }